

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

double __thiscall libDAI::MaxPlus::run(MaxPlus *this)

{
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  _List_node_base **pp_Var1;
  value vVar2;
  VarSet *pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *poVar8;
  long lVar9;
  size_type sVar10;
  ulong uVar11;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var12;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  reference pvVar16;
  size_t sVar17;
  _List_node_base *p_Var18;
  iterator iVar19;
  long lVar20;
  unsigned_long uVar21;
  size_t iI_1;
  long *plVar22;
  size_t val_i;
  unsigned_long uVar23;
  size_t t;
  VarSet *x;
  long lVar24;
  long *plVar25;
  const_iterator __position;
  size_t iI;
  ulong uVar26;
  pointer pVVar27;
  double dVar28;
  Real RVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 in_XMM2_Qb;
  pointer local_1b8;
  Prob ECV;
  vector<double,_std::allocator<double>_> residuals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> old_beliefs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v_empty;
  Diffs diffs;
  timeval cur_time;
  timeval start_time;
  vector<unsigned_long,_std::allocator<unsigned_long>_> max_indices;
  VarSet local_50;
  long *plVar7;
  
  iVar6 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  this->bestValue = -INFINITY;
  if (1 < (this->Props).verbose) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&diffs,this);
    poVar8 = std::operator<<(poVar8,(string *)&diffs);
    poVar8 = std::operator<<(poVar8,"...");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&diffs);
    if (2 < (this->Props).verbose) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  iVar6 = gettimeofday((timeval *)&start_time,(__timezone_ptr_t)0x0);
  if (iVar6 != 0) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar15 = "Error with gettimeofday";
    __cxa_throw(puVar15,&char_const*::typeinfo,0);
  }
  toc();
  lVar9 = (**(code **)(*plVar7 + 0x28))(plVar7);
  Diffs::Diffs(&diffs,lVar9,1.0);
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar10 = (**(code **)(*plVar7 + 0x28))(plVar7);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
            (&old_beliefs,sVar10);
  for (uVar26 = 0; uVar11 = (**(code **)(*plVar7 + 0x28))(plVar7), uVar26 < uVar11;
      uVar26 = uVar26 + 1) {
    lVar9 = (**(code **)(*plVar7 + 0x30))(plVar7,uVar26);
    TProb<double>::TProb((TProb<double> *)&ECV,*(size_t *)(lVar9 + 8),0.0);
    std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
    emplace_back<libDAI::TProb<double>>
              ((vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)&old_beliefs,
               (TProb<double> *)&ECV);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&ECV);
  }
  if ((this->Props).updates.v == SEQMAX) {
    for (uVar26 = 0; uVar11 = plVar7[9] - plVar7[8] >> 4, uVar26 < uVar11; uVar26 = uVar26 + 1) {
      calcNewMessage(this,uVar26);
    }
    std::vector<double,_std::allocator<double>_>::reserve(&residuals,uVar11);
    lVar9 = 0;
    for (uVar26 = 0; uVar26 < (ulong)(plVar7[9] - plVar7[8] >> 4); uVar26 = uVar26 + 1) {
      ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)dist((TProb<double> *)
                               ((long)&(((this->_newmessages).
                                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_p).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar9),
                               (TProb<double> *)
                               ((long)&(((this->_messages).
                                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_p).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar9),DISTLINF);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&residuals,(double *)&ECV);
      lVar9 = lVar9 + 0x18;
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&edge_seq,plVar7[9] - plVar7[8] >> 4);
    for (ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = (pointer)0x0;
        ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start < (pointer)(plVar7[9] - plVar7[8] >> 4);
        ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((long)ECV._p.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 1)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&edge_seq,(value_type_conflict2 *)&ECV);
    }
  }
  this_00 = &this->_valConfs;
  uVar26 = 0;
LAB_00506d4d:
  this->_iterations = uVar26;
  if (((this->Props).maxiter <= uVar26) ||
     (dVar28 = Diffs::max(&diffs), dVar28 <= (this->Props).tol)) {
    if (this->writeAnyTimeResults == true) {
      std::endl<char,std::char_traits<char>>((ostream *)this->results_f);
      std::endl<char,std::char_traits<char>>((ostream *)this->timings_f);
    }
    dVar28 = Diffs::max(&diffs);
    if (this->_maxdiff < dVar28) {
      dVar28 = Diffs::max(&diffs);
      this->_maxdiff = dVar28;
    }
    if (1 < (this->Props).verbose) {
      dVar28 = Diffs::max(&diffs);
      if (dVar28 <= (this->Props).tol) {
        poVar8 = std::operator<<((ostream *)&std::cout,"MaxPlus::run:  ");
        poVar8 = std::operator<<(poVar8,"converged in ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8," passes (");
        toc();
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        poVar8 = std::operator<<(poVar8," clocks).");
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "MaxPlus::run:  WARNING: not converged within ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8," passes (");
        toc();
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::operator<<(poVar8," clocks)...final maxdiff:");
        dVar28 = Diffs::max(&diffs);
        poVar8 = std::ostream::_M_insert<double>(dVar28);
      }
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    dVar28 = this->bestValue;
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
              (&old_beliefs);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&residuals.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
    return dVar28;
  }
  if (5 < (this->Props).verbose) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Start iteration ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)&std::cout,"old messages:");
    poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = libDAI::operator<<(poVar8,&this->_messages);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  vVar2 = (this->Props).updates.v;
  if (vVar2 == SEQRND) {
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
LAB_00506f87:
    for (uVar26 = 0; uVar26 < (ulong)(plVar7[9] - plVar7[8] >> 4); uVar26 = uVar26 + 1) {
      sVar17 = edge_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar26];
      calcNewMessage(this,sVar17);
      updateMessage(this,sVar17);
    }
  }
  else if (vVar2 == SEQMAX) {
    for (uVar26 = 0; uVar26 < (ulong)(plVar7[9] - plVar7[8] >> 4); uVar26 = uVar26 + 1) {
      _Var12 = std::
               __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      lVar9 = (long)_Var12._M_current -
              (long)residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      sVar17 = lVar9 >> 3;
      updateMessage(this,sVar17);
      lVar24 = sVar17 * 0x10;
      *(undefined8 *)
       ((long)residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar9) = 0;
      lVar20 = plVar7[0xe];
      lVar9 = *(long *)(plVar7[8] + lVar24);
      lVar24 = *(long *)(plVar7[8] + 8 + lVar24);
      lVar13 = lVar9 * 0x18;
      for (plVar25 = *(long **)(lVar20 + lVar13); plVar25 != *(long **)(lVar20 + 8 + lVar13);
          plVar25 = plVar25 + 1) {
        lVar14 = *plVar25;
        if (lVar14 != lVar24) {
          lVar20 = plVar7[0x11];
          for (plVar22 = *(long **)(lVar20 + lVar14 * 0x18);
              plVar22 != *(long **)(lVar20 + 8 + lVar14 * 0x18); plVar22 = plVar22 + 1) {
            if (*plVar22 != lVar9) {
              sVar17 = *(size_t *)(*(long *)(plVar7[0xb] + *plVar22 * 0x18) + lVar14 * 8);
              calcNewMessage(this,sVar17);
              RVar29 = dist((this->_newmessages).
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sVar17,
                            (this->_messages).
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sVar17,DISTLINF);
              residuals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar17] = RVar29;
              lVar14 = *plVar25;
              lVar20 = plVar7[0x11];
            }
          }
          lVar20 = plVar7[0xe];
        }
      }
    }
  }
  else {
    if (vVar2 != PARALL) goto LAB_00506f87;
    uVar26 = 0;
    while( true ) {
      lVar9 = plVar7[9];
      lVar24 = plVar7[8];
      if ((ulong)(lVar9 - lVar24 >> 4) <= uVar26) break;
      calcNewMessage(this,uVar26);
      uVar26 = uVar26 + 1;
    }
    for (uVar26 = 0; uVar26 < (ulong)(lVar9 - lVar24 >> 4); uVar26 = uVar26 + 1) {
      updateMessage(this,uVar26);
      lVar24 = plVar7[8];
      lVar9 = plVar7[9];
    }
  }
  sVar10 = (**(code **)(*plVar7 + 0x28))(plVar7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &max_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,sVar10,
             (allocator_type *)&ECV);
  uVar26 = 0;
  while( true ) {
    uVar11 = (**(code **)(*plVar7 + 0x28))(plVar7);
    if (uVar11 <= uVar26) break;
    lVar9 = (**(code **)(*plVar7 + 0x30))(plVar7,uVar26);
    TProb<double>::TProb(&ECV,*(size_t *)(lVar9 + 8),0.0);
    lVar9 = plVar7[0xe];
    for (plVar25 = *(long **)(lVar9 + uVar26 * 0x18);
        plVar25 != *(long **)(lVar9 + 8 + uVar26 * 0x18); plVar25 = plVar25 + 1) {
      TProb<double>::operator+=
                (&ECV,(this->_messages).
                      super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + *plVar25 * 8));
      lVar9 = plVar7[0xe];
    }
    auVar30 = ZEXT816(0xfff0000000000000);
    uVar21 = 0;
    for (uVar23 = 0;
        (long)ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != uVar23; uVar23 = uVar23 + 1) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar23];
      dVar28 = auVar30._0_8_;
      auVar30 = vmaxsd_avx(auVar31,auVar30);
      if (dVar28 < ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23]) {
        uVar21 = uVar23;
      }
    }
    max_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar26] = uVar21;
    RVar29 = dist((TProb<double> *)&ECV,
                  old_beliefs.
                  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar26,DISTLINF);
    Diffs::push(&diffs,RVar29);
    TProb<double>::operator=
              (old_beliefs.
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar26,(TProb<double> *)&ECV);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&ECV);
    uVar26 = uVar26 + 1;
  }
  if (2 < (this->Props).verbose) {
    std::operator<<((ostream *)&std::cout,"MaxPlus::run:  maxdiff ");
    dVar28 = Diffs::max(&diffs);
    poVar8 = std::ostream::_M_insert<double>(dVar28);
    poVar8 = std::operator<<(poVar8," after ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," passes");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  puVar15 = (undefined8 *)(**(code **)(*plVar7 + 0x58))(plVar7);
  x = (VarSet *)*puVar15;
  pVVar3 = (VarSet *)puVar15[1];
  local_1b8 = (pointer)0x0;
  for (; x != pVVar3; x = (VarSet *)&x[1]._statespace) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ECV,
               (long)(x->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(x->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&v_empty);
    lVar9 = 0;
    for (pVVar27 = (x->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pVVar27 !=
        (x->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish; pVVar27 = pVVar27 + 1) {
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &max_indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                           pVVar27->_label);
      *(value_type *)
       ((long)ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar9 * 2) = *pvVar16;
      lVar9 = lVar9 + 4;
    }
    VarSet::VarSet(&local_50,x);
    sVar17 = TFactor<double>::IndividualToJointFactorIndex
                       (&local_50,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ECV);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
    local_1b8 = (pointer)((double)local_1b8 +
                         (double)(&(x[1]._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_label)[sVar17]);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ECV);
  }
  if (2 < (this->Props).verbose) {
    std::operator<<((ostream *)&std::cout,"current estimated maximizing configuration attains: ");
    poVar8 = std::ostream::_M_insert<double>((double)local_1b8);
    poVar8 = std::operator<<(poVar8," (the k=");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::operator<<(poVar8,"-th Value is ");
    poVar8 = std::ostream::_M_insert<double>(this->_k_th_Val);
    poVar8 = std::operator<<(poVar8,")");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  if (this->_k_th_Val + 1e-09 < (double)local_1b8) {
    if (3 < (this->Props).verbose) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "\tchecking to add this configuration to solutions");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    iVar6 = 0;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      bVar4 = true;
      if (__position._M_node == (_List_node_base *)this_00) break;
      p_Var18 = __position._M_node[1]._M_next;
      if (4 < (this->Props).verbose) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "\tchecking to see if it should be inserted before the entry at position "
                                );
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar6);
        std::operator<<(poVar8," (with value ");
        poVar8 = std::ostream::_M_insert<double>((double)p_Var18);
        poVar8 = std::operator<<(poVar8,")...");
        std::endl<char,std::char_traits<char>>(poVar8);
        if (((double)local_1b8 + 1e-09 < (double)p_Var18) && (4 < (this->Props).verbose)) {
          std::operator<<((ostream *)&std::cout,"\tYes!  valuesum(");
          poVar8 = std::ostream::_M_insert<double>((double)local_1b8);
          std::operator<<(poVar8,") + V_EPS(");
          poVar8 = std::ostream::_M_insert<double>(1e-09);
          std::operator<<(poVar8,") < vcval(");
          poVar8 = std::ostream::_M_insert<double>((double)p_Var18);
          poVar8 = std::operator<<(poVar8," )");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
      }
      bVar5 = MADP_util::EqualValue((double)p_Var18,(double)local_1b8);
      if (bVar5) {
        if (4 < (this->Props).verbose) {
          std::operator<<((ostream *)&std::cout,"\tYes!  valuesum(");
          poVar8 = std::ostream::_M_insert<double>((double)local_1b8);
          std::operator<<(poVar8,") + V_EPS(");
          poVar8 = std::ostream::_M_insert<double>(1e-09);
          std::operator<<(poVar8,") == vcval(");
          poVar8 = std::ostream::_M_insert<double>((double)p_Var18);
          poVar8 = std::operator<<(poVar8," )");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        p_Var18 = __position._M_node[1]._M_prev;
        uVar26 = 0;
        goto LAB_005074ff;
      }
      iVar6 = iVar6 + 1;
    } while ((double)p_Var18 <= (double)local_1b8 + 1e-09);
    goto LAB_0050755e;
  }
  goto LAB_005076d8;
  while( true ) {
    pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &max_indices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,uVar26);
    p_Var18 = __position._M_node[1]._M_prev;
    pp_Var1 = &p_Var18->_M_next + uVar26;
    uVar26 = uVar26 + 1;
    if ((_List_node_base *)*pvVar16 != *pp_Var1) break;
LAB_005074ff:
    if ((ulong)((long)__position._M_node[2]._M_next - (long)p_Var18 >> 3) <= uVar26) {
      if (3 < (this->Props).verbose) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "\tnewly found conf identical to one already stored...");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      bVar4 = false;
      break;
    }
  }
LAB_0050755e:
  if ((__position._M_node ==
       (this_00->
       super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       )._M_impl._M_node.super__List_node_base._M_next) &&
     ((this->_valConfs).
      super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ._M_impl._M_node._M_size == this->_k)) {
    if (3 < (this->Props).verbose) {
      std::operator<<((ostream *)&std::cout,"\tDon\'t bother value (");
      poVar8 = std::ostream::_M_insert<double>((double)local_1b8);
      poVar8 = std::operator<<(poVar8,") not high enough...");
      std::endl<char,std::char_traits<char>>(poVar8);
LAB_005076b3:
      if (3 < (this->Props).verbose) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "\t*NOT* inserting the newly found configuration");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
    }
  }
  else {
    if (!bVar4) goto LAB_005076b3;
    v_empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v_empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v_empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_1b8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,&v_empty);
    iVar19 = std::__cxx11::
             list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::insert(this_00,__position,(value_type *)&ECV);
    if (3 < (this->Props).verbose) {
      std::operator<<((ostream *)&std::cout,"\tvalue of inserted valconf = ");
      poVar8 = std::ostream::_M_insert<double>((double)iVar19._M_node[1]._M_next);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&iVar19._M_node[1]._M_prev,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &max_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    uVar26 = this->_k;
    uVar11 = (this->_valConfs).
             super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ._M_impl._M_node._M_size;
    if (uVar26 < uVar11) {
      std::__cxx11::
      list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::pop_front(this_00);
      uVar26 = this->_k;
      uVar11 = (this->_valConfs).
               super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl._M_node._M_size;
    }
    if (uVar11 == uVar26) {
      this->_k_th_Val =
           (double)(this->_valConfs).
                   super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ECV._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&v_empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
LAB_005076d8:
  if (this->bestValue < (double)local_1b8) {
    this->bestValue = (double)local_1b8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->bestConfiguration,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &max_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    iVar6 = gettimeofday((timeval *)&cur_time,(__timezone_ptr_t)0x0);
    if (iVar6 != 0) {
      puVar15 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar15 = "Error with gettimeofday";
      __cxa_throw(puVar15,&char_const*::typeinfo,0);
    }
    auVar30._0_8_ = (double)(cur_time.tv_sec - start_time.tv_sec);
    auVar30._8_8_ = in_XMM2_Qb;
    auVar32._0_8_ = (double)(cur_time.tv_usec - start_time.tv_usec);
    auVar32._8_8_ = in_XMM2_Qb;
    auVar30 = vfmadd231sd_fma(auVar32,auVar30,ZEXT816(0x412e848000000000));
    if (this->writeAnyTimeResults == true) {
      poVar8 = std::ostream::_M_insert<double>(this->bestValue);
      std::operator<<(poVar8,"\t");
      poVar8 = std::ostream::_M_insert<double>(auVar30._0_8_);
      std::operator<<(poVar8,"\t");
    }
    if ((this->Props).verbose < 2) goto LAB_00507846;
    std::operator<<((ostream *)&std::cout,"new best configuration found, value = ");
    poVar8 = std::ostream::_M_insert<double>(this->bestValue);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  if (5 < (this->Props).verbose) {
    poVar8 = std::operator<<((ostream *)&std::cout,"new messages:");
    poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = libDAI::operator<<(poVar8,&this->_messages);
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)&std::cout,"ending iteration ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
LAB_00507846:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&max_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  uVar26 = this->_iterations + 1;
  goto LAB_00506d4d;
}

Assistant:

double MaxPlus::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        clock_t tic = toc();
        Diffs diffs(g.nrVars(), 1.0);
        
        vector<size_t> edge_seq; //what does this contain? an ordering (sequence) of edge(indice)s ?
        vector<double> residuals;


        //vector<Factor> old_beliefs;
        vector<Prob> old_beliefs;
        old_beliefs.reserve( g.nrVars() );
        for( size_t i = 0; i < g.nrVars(); i++ )
            //old_beliefs.push_back(beliefV(i));
            //FRANS: we don't want a belief in here but simple a vector with all 0's
            //old_beliefs.push_back(  Factor( g.var(i), 0.0 )  );
            old_beliefs.push_back(  Prob( g.var(i).states(), 0.0 )  );

        if( Props.updates == UpdateType::SEQMAX ) {
            // do the first pass
            for(size_t iI = 0; iI < g.nrEdges(); iI++ ) 
                calcNewMessage(iI);

            // calculate initial residuals
            residuals.reserve(g.nrEdges());
            for( size_t iI = 0; iI < g.nrEdges(); iI++ )
                residuals.push_back( dist( _newmessages[iI], _messages[iI], Prob::DISTLINF ) );
        } else {
            edge_seq.reserve( g.nrEdges() );
            for( size_t e = 0; e < g.nrEdges(); e++ )
                edge_seq.push_back( e );
        }

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) 
        {
            if( Props.verbose >= 6)
            {
               cout << "Start iteration "<<_iterations<<endl ; 
               cout << "old messages:"<< endl << _messages << endl;
            }

            // ---------First update the messages------------
            if( Props.updates == UpdateType::SEQMAX ) {
                // Residuals-MaxPlus by Koller et al.
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    // update the message with the largest residual
                    size_t iI = max_element(residuals.begin(), residuals.end()) - residuals.begin();
                    updateMessage( iI );
                    residuals[iI] = 0;

                    // I->i has been updated, which means that residuals for all
                    // J->j with J in nb[i]\I and j in nb[J]\i have to be updated
                    size_t i = g.edge(iI).first;
                    size_t I = g.edge(iI).second;
                    for( FactorGraph::nb_cit J = g.nbV(i).begin(); J != g.nbV(i).end(); J++ ) 
                        if( *J != I )
                            for( FactorGraph::nb_cit j = g.nbF(*J).begin(); j != g.nbF(*J).end(); j++ )
                                if( *j != i ) {
                                    size_t jJ = g.edge(*j,*J);
                                    calcNewMessage(jJ);
                                    residuals[jJ] = dist( _newmessages[jJ], _messages[jJ], Prob::DISTLINF );
                                }
                }
            } else if( Props.updates == UpdateType::PARALL ) {
                // Parallel updates 
                for( size_t t = 0; t < g.nrEdges(); t++ )
                    calcNewMessage(t);

                for( size_t t = 0; t < g.nrEdges(); t++ )
                    updateMessage( t );
            } else {
                // Sequential updates
                if( Props.updates == UpdateType::SEQRND )
                    random_shuffle( edge_seq.begin(), edge_seq.end() );
                
                for( size_t t = 0; t < g.nrEdges(); t++ ) {
                    size_t k = edge_seq[t]; //FRANS: k is what?
                    calcNewMessage( k );
                    updateMessage( k );
                }
            }
            
            // ---------End updating the messages------------


            // compute, for each variable, the value that maximizes the sum of the factors it 
            // participates in.
            // I.e., if v0 is var with 3 values ('states') a,b,c and participates in F0 and F1, 
            // and it received the following messages
            //      Mess F0 -> v0 = [0 6 0 ]
            //      Mess F1 -> v0 = [3 0 0 ]
            // then it should take value b, corresponding to the maximizing index in
            // the vector [3 6 0], which we call the 
            //  `estimated contribution vector' ECV

            //max_indices stores the indices of the maximizing values ('states') for each variable
            vector<size_t> max_indices( g.nrVars() );
            for( size_t i = 0; i < g.nrVars(); i++ )
            {
                /* need not use Factor class here...
                Factor ECV( g.var( i ), 0.0);
                Var i_th_var = g.var(i);
                VarSet temp_vs (i_th_var);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += Factor( temp_vs, message(i,*I) );
                */
                Prob ECV( g.var(i).states() , 0.0);
                //loop over factors I that are neighbors of var i
                for( FactorGraph::nb_cit I = g.nbV(i).begin(); I != g.nbV(i).end(); I++ )
                    ECV += message(i,*I);

                //find the maximum index (i.e., the value the variable should take according to ECV)
                Real Z = -INFINITY;
                size_t max_val_i = 0;
                for( size_t val_i = 0; val_i < ECV.size(); val_i++ ) {
                    if( ECV[val_i] > Z )
                    {
                        Z = ECV[val_i];
                        max_val_i = val_i;
                    }
                }
                max_indices[i] = max_val_i;
#if 0                
                if( Props.verbose >= 3)
                {
                    cout << "ECV for var "<<i<<" = "<< ECV ;
                    if( Props.verbose >= 4)
                        cout << "->best value of var "<<i<<" is " << max_val_i << " (with expected sum "<<Z<<")";
                    cout << endl;
                }
#endif                 

                //compute distance to last ECV
                Real d =  dist( ECV, old_beliefs[i], Prob::DISTLINF );
                diffs.push( d );
#if 0                
                if( Props.verbose >= 4 ) {
                    if( Props.verbose >= 6 )
                        cout << "\t\t\told_beliefs[i]"<< old_beliefs[i] <<endl << "\t\t\tdist d="<<d<<endl;
                    cout << "\t\tdiffs = "<<diffs<<endl;
                }
#endif                 
                old_beliefs[i] = ECV;
            }
            if( Props.verbose >= 3 )
                cout << "MaxPlus::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;

            //compute the value of the currently chosen config
            //
            const std::vector<Factor> & factor_vec = g.factors();
            std::vector<Factor>::const_iterator it = factor_vec.begin();
            std::vector<Factor>::const_iterator last = factor_vec.end();

            double valuesum = 0.0;
            while(it != last) //loop over all factors to compute value
            {
                const Factor & f = *it;
                const VarSet & vs = f.vars();

                //we need to compute the index into f.p() that corresponds to 
                //the (state) configuration as defined by max_indices.
                //
                //suppose the state configuration is <2 1 3 5>, 
                //when f includes vars 1 2 and 4, the relevant configuration is <2 1 5>
                //suppose that the number of states of these relevant vars is <3 4 6>,
                //then the index should be computed as
                //2 + 1 * (3) + 5 * (3*4) = 2 + 3 + 60 = 65
                //
                //(remember the index with the lowest index is the least significant in libDAI)

                //first we construct the vector of 'relevant' indices (those for vs)
                vector<size_t> relevant_state_indices(vs.size());                
                int i=0;
                for(VarSet::const_iterator cit = vs.begin(); cit != vs.end(); cit++)
                { 
                    //the index ('label') of the next of the variable of vs:
                    long lab =  (*cit).label();                    
                    // the (index of the) value(state) that variable
                    //takes in the (estimated) maximizing configuration:
                    //!!! if it crashes here: is the FG connected 'enough' ?! (because it will give problems of not!)
                    //(i.e., if not all variables are included in a factor, things mess up here...)
                    size_t val = max_indices.at(lab);
                    //relevant_state_indices.push_back( val );
                    relevant_state_indices[i] = val;
                    i++;
                }
                //now compute the 'joint factor' index
                size_t facIndex = Factor::IndividualToJointFactorIndex(vs, relevant_state_indices);
                valuesum += f[facIndex];
                it++;
            }
            if( Props.verbose >= 3)
                cout << "current estimated maximizing configuration attains: " << 
                    valuesum << 
                    " (the k=" <<_k<< "-th Value is " << _k_th_Val << ")" << endl;

            if(valuesum > _k_th_Val + V_EPS)
            {
                if( Props.verbose >= 4)
                    cout << "\tchecking to add this configuration to solutions"<<endl;
                list< MADP_util::valConf >::iterator it = _valConfs.begin();
                //boolean that indicates whether we should store max_indices
                bool insert_element = true;
                int pos = 0;
                while(it != _valConfs.end() )
                {
                    valConf& vc = *it;
                    double vcval = vc.first;
                    
                    if( Props.verbose >= 5)
                        cout << "\tchecking to see if it should be inserted before the entry at position "<< pos << " (with value "<<vcval<<")..."<<endl;

                    //boolean that will indicate whether the new found policy needs
                    //to be inserted before vc
                    bool insert_before_vc = false;
                    if( valuesum + V_EPS < vcval)
                    {
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") < vcval("<<vcval<<" )"<<endl;
                    }
                        
                    if( EqualValue(vcval, valuesum) )
                    {
                        //insert before vc 
                        insert_before_vc = true;
                        if( Props.verbose >= 5)
                            cout << "\tYes!  valuesum("<<valuesum<<") + V_EPS("<<
                                V_EPS<<") == vcval("<<vcval<<" )"<<endl;

                        //but make sure the condigurations are different!
                        vector<size_t>& vcconf=vc.second;
                        bool identical = true;
                        for( size_t i=0; i < vcconf.size(); i++)
                        {
                            if(max_indices.at(i) != vcconf[i] )
                            {
                                identical = false;
                                break;
                            }
                        }
                        if(identical)
                        {
                            if( Props.verbose >= 4)
                                cout <<"\tnewly found conf identical to one already stored..."<<endl;
                            insert_element = false;
                        }
                    }

                    if(insert_before_vc)
                        break;

                    it++;
                    pos++;
                }
                //it now points to the element before which max_indices should be
                //inserted
                if(it == _valConfs.begin() && _valConfs.size() == _k )
                {
                    if( Props.verbose >= 4)
                        cout <<"\tDon't bother value ("<< valuesum <<
                            ") not high enough..."<< endl;
                    //don't bother, since the new one become the k+1-th element
                    insert_element = false;
                }
                if(insert_element)
                {
                    //to avoid uneceesary copying, we insert an 'empty' valconf
                    vector<size_t> v_empty;
                    valConf empty_vc = make_pair(valuesum, v_empty );
                    list< valConf >::iterator new_el_it = _valConfs.insert(it, empty_vc);
                    valConf& new_vc = (*new_el_it);
                    if( Props.verbose >= 4)
                        cout <<"\tvalue of inserted valconf = "<< new_vc.first<<endl;
                    new_vc.second = max_indices;
                    //check to see if we need to delete the last element
                    if(_valConfs.size() > _k)
                        _valConfs.pop_front();
                    if(_valConfs.size() == _k)
                        _k_th_Val = _valConfs.front().first;
                }
                else
                    if( Props.verbose >= 4)
                        cout <<"\t*NOT* inserting the newly found configuration"<< endl;

            }
            if(valuesum > bestValue)
            {
                bestValue = valuesum;
                bestConfiguration = max_indices;
                if(gettimeofday(&cur_time, NULL) != 0)
                    throw "Error with gettimeofday";

                time_t delta_sec = cur_time.tv_sec - start_time.tv_sec;
                suseconds_t delta_usec = cur_time.tv_usec - start_time.tv_usec;
                double delta = 1000000.0 * delta_sec + delta_usec; //in microsecond

                if(writeAnyTimeResults){
                    (*results_f) << bestValue << "\t";
                    (*timings_f) << delta << "\t";
                } 

                if( Props.verbose >= 2)
                    cout << "new best configuration found, value = "<< bestValue << endl;
            }
            if( Props.verbose >= 6)
            {
                cout << "new messages:"<< endl << _messages << endl;
                cout << "ending iteration "<<_iterations<<endl<<endl ; 
            }
        } // <- end of iteration

        //end the line in the results file
        if(writeAnyTimeResults){
            (*results_f) << endl;
            (*timings_f) << endl;
        } 
        
        if( diffs.max() > _maxdiff ) //store the max difference for later inspection.
            _maxdiff = diffs.max();
        if( Props.verbose >= 2 )
        {
            if( diffs.max() > Props.tol ) 
                cout << "MaxPlus::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            else  
                cout << "MaxPlus::run:  " << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
        }
        
        //return diffs.max();
        return bestValue;
    }